

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<int,_unsigned_int> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_unsigned_int>_>::findNode<int>
          (Data<QHashPrivate::Node<int,_unsigned_int>_> *this,int *key)

{
  long lVar1;
  bool bVar2;
  Node<int,_unsigned_int> *pNVar3;
  int *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<int,_unsigned_int>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<int>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x7d7c2b);
  if (bVar2) {
    pNVar3 = (Node<int,_unsigned_int> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x7d7c46);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }